

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectCreateWindow(SDLGraphicsSystemTests *this)

{
  WrapperMock *this_00;
  TypedExpectation<int_(unsigned_int)> *this_01;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_02;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_03;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *x_00;
  undefined1 local_120 [32];
  MockSpec<int_(unsigned_int)> local_100;
  ReturnAction<int> local_e0;
  MatcherBase<unsigned_int> local_d0;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_b8;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_90;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_68;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_40;
  
  this_00 = &((this->sdlMock).rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_d0,0x20);
  SDL::WrapperMock::gmock_init(&local_100,this_00,(Matcher<unsigned_int> *)&local_d0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      (&local_100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x68,"*sdlMock","init(0x00000020u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_e0,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(unsigned_int)> *)local_120,(ReturnAction *)&local_e0);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce
            (this_01,(Action<int_(unsigned_int)> *)local_120);
  std::_Function_base::~_Function_base((_Function_base *)local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_100.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_d0);
  this_02 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_40,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_90,(testing *)&local_40,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)local_120,
             (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_90);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)&local_100,(ReturnAction *)local_120);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_02,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)&local_100);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_90);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_40);
  this_03 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  makeSDLRenderer((UniquePtr<SDL_Renderer> *)&local_68,this,(SDL_Renderer_conflict *)0x2);
  testing::ByMove<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_> *
             )&local_b8,(testing *)&local_68,x_00);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>>
            ((testing *)local_120,
             (ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_> *
             )&local_b8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
              *)&local_100,(ReturnAction *)local_120);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_03,(Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                      *)&local_100);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_b8);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_68);
  SDLGraphicsSystem::createWindow
            (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  return;
}

Assistant:

void expectCreateWindow() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr)
            .WillOnce(Return(ByMove(makeSDLRenderer(rendererPtr))));
        system.createWindow(title, windowWidth, windowHeight);
    }